

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O2

Ptr __thiscall core::image::int_to_byte_image(image *this,ConstPtr *image)

{
  uint uVar1;
  element_type *peVar2;
  pointer piVar3;
  int i;
  long lVar4;
  invalid_argument *this_00;
  uint uVar5;
  Ptr PVar6;
  
  if ((image->super___shared_ptr<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    Image<unsigned_char>::create();
    peVar2 = (image->super___shared_ptr<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    TypedImageBase<unsigned_char>::allocate
              (*(TypedImageBase<unsigned_char> **)this,
               (peVar2->super_TypedImageBase<int>).super_ImageBase.w,
               (peVar2->super_TypedImageBase<int>).super_ImageBase.h,
               (peVar2->super_TypedImageBase<int>).super_ImageBase.c);
    lVar4 = 0;
    while( true ) {
      peVar2 = (image->super___shared_ptr<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      piVar3 = (peVar2->super_TypedImageBase<int>).data.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (long)(int)((ulong)((long)*(pointer *)
                                         ((long)&(peVar2->super_TypedImageBase<int>).data.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 8) - (long)piVar3
                                 ) >> 2);
      if ((long)PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi <= lVar4) break;
      uVar1 = piVar3[lVar4];
      uVar5 = -uVar1;
      if (0 < (int)uVar1) {
        uVar5 = uVar1;
      }
      if (0xfe < uVar5) {
        uVar5 = 0xff;
      }
      *(char *)(*(long *)(*(long *)this + 0x18) + lVar4) = (char)uVar5;
      lVar4 = lVar4 + 1;
    }
    PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ByteImage::Ptr
int_to_byte_image (IntImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        img->at(i) = math::clamp(std::abs(image->at(i)), 0, 255);
    }
    return img;
}